

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O0

bool __thiscall
FIX::double_conversion::FastFixedDtoa
          (double_conversion *this,double v,int fractional_count,Vector<char> buffer,int *length,
          int *decimal_point)

{
  ulong uVar1;
  double_conversion *this_00;
  char *pcVar2;
  byte bVar3;
  uint32_t number;
  undefined4 in_register_00000034;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  Vector<char> buffer_03;
  Vector<char> buffer_04;
  Vector<char> buffer_05;
  Vector<char> buffer_06;
  Vector<char> buffer_07;
  int *in_stack_fffffffffffffed0;
  uint64_t fractionals;
  uint64_t integrals;
  uint64_t local_98;
  uint64_t remainder;
  uint32_t quotient;
  uint64_t dividend;
  int divisor_power;
  uint64_t divisor;
  uint64_t kFive17;
  uint local_5c;
  int exponent;
  double_conversion *local_50;
  uint64_t significand;
  int *piStack_40;
  uint32_t kMaxUInt32;
  int *decimal_point_local;
  int *length_local;
  double dStack_28;
  int fractional_count_local;
  double v_local;
  Vector<char> buffer_local;
  
  v_local = (double)CONCAT44(in_register_00000034,fractional_count);
  decimal_point_local = buffer._8_8_;
  buffer_local.start_._0_4_ = (uint)buffer.start_;
  length_local._4_4_ = (int)this;
  significand._4_4_ = 0xffffffff;
  piStack_40 = length;
  dStack_28 = v;
  Double::Double((Double *)&stack0xffffffffffffffa8,v);
  local_50 = (double_conversion *)Double::Significand((Double *)&stack0xffffffffffffffa8);
  Double::Double((Double *)&kFive17,dStack_28);
  local_5c = Double::Exponent((Double *)&kFive17);
  if ((int)local_5c < 0x15) {
    if (length_local._4_4_ < 0x15) {
      *decimal_point_local = 0;
      bVar3 = (byte)local_5c;
      number = SUB84(v_local,0);
      if ((int)(local_5c + 0x35) < 0x41) {
        if ((int)local_5c < 0) {
          if ((int)local_5c < -0x34) {
            if ((int)local_5c < -0x80) {
              if (0x14 < length_local._4_4_) {
                __assert_fail("fractional_count <= 20",
                              "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fixed-dtoa.cc"
                              ,0x181,
                              "bool FIX::double_conversion::FastFixedDtoa(double, int, Vector<char>, int *, int *)"
                             );
              }
              pcVar2 = Vector<char>::operator[]((Vector<char> *)&v_local,0);
              *pcVar2 = '\0';
              *decimal_point_local = 0;
              *piStack_40 = -length_local._4_4_;
            }
            else {
              *piStack_40 = 0;
              length = (int *)(ulong)(uint)buffer_local.start_;
              buffer_07._8_8_ = decimal_point_local;
              buffer_07.start_ = (char *)length;
              FillFractionals(local_50,(ulong)local_5c,length_local._4_4_,number,buffer_07,
                              piStack_40,in_stack_fffffffffffffed0);
            }
          }
          else {
            uVar1 = (ulong)local_50 >> (-bVar3 & 0x3f);
            this_00 = local_50 + -(uVar1 << (-bVar3 & 0x3f));
            if (uVar1 < 0x100000000) {
              buffer_01._8_8_ = decimal_point_local;
              buffer_01.start_ = (char *)(ulong)(uint)buffer_local.start_;
              FillDigits32((double_conversion *)(uVar1 & 0xffffffff),number,buffer_01,length);
            }
            else {
              buffer_04.length_ = (uint)buffer_local.start_;
              buffer_04.start_ = (char *)v_local;
              buffer_04._12_4_ = 0;
              FillDigits64(uVar1,buffer_04,decimal_point_local);
            }
            *piStack_40 = *decimal_point_local;
            length = (int *)(ulong)(uint)buffer_local.start_;
            buffer_06._8_8_ = decimal_point_local;
            buffer_06.start_ = (char *)length;
            FillFractionals(this_00,(ulong)local_5c,length_local._4_4_,SUB84(v_local,0),buffer_06,
                            piStack_40,in_stack_fffffffffffffed0);
          }
        }
        else {
          local_50 = (double_conversion *)((long)local_50 << (bVar3 & 0x3f));
          buffer_03.length_ = (uint)buffer_local.start_;
          buffer_03.start_ = (char *)v_local;
          buffer_03._12_4_ = 0;
          FillDigits64((uint64_t)local_50,buffer_03,decimal_point_local);
          *piStack_40 = *decimal_point_local;
        }
      }
      else {
        if ((int)local_5c < 0x12) {
          uVar1 = 0xb1a2bc2ec5 << (0x11 - bVar3 & 0x3f);
          remainder._4_4_ = (uint)((ulong)local_50 / uVar1);
          local_98 = (ulong)local_50 % uVar1 << (bVar3 & 0x3f);
        }
        else {
          uVar1 = (long)local_50 << (bVar3 - 0x11 & 0x3f);
          remainder._4_4_ = (uint)(uVar1 / 0xb1a2bc2ec5);
          local_98 = uVar1 % 0xb1a2bc2ec5 << 0x11;
        }
        buffer_00._8_8_ = decimal_point_local;
        buffer_00.start_ = (char *)(ulong)(uint)buffer_local.start_;
        FillDigits32((double_conversion *)(ulong)remainder._4_4_,number,buffer_00,length);
        buffer_02.length_ = (uint)buffer_local.start_;
        buffer_02.start_ = (char *)v_local;
        buffer_02._12_4_ = 0;
        FillDigits64FixedLength(local_98,buffer_02,decimal_point_local);
        *piStack_40 = *decimal_point_local;
      }
      buffer_05._8_8_ = decimal_point_local;
      buffer_05.start_ = (char *)(ulong)(uint)buffer_local.start_;
      TrimZeros((double_conversion *)v_local,buffer_05,piStack_40,length);
      pcVar2 = Vector<char>::operator[]((Vector<char> *)&v_local,*decimal_point_local);
      *pcVar2 = '\0';
      if (*decimal_point_local == 0) {
        *piStack_40 = -length_local._4_4_;
      }
      buffer_local._15_1_ = 1;
    }
    else {
      buffer_local._15_1_ = 0;
    }
  }
  else {
    buffer_local._15_1_ = 0;
  }
  return (bool)buffer_local._15_1_;
}

Assistant:

bool FastFixedDtoa(double v,
                   int fractional_count,
                   Vector<char> buffer,
                   int* length,
                   int* decimal_point) {
  const uint32_t kMaxUInt32 = 0xFFFFFFFF;
  uint64_t significand = Double(v).Significand();
  int exponent = Double(v).Exponent();
  // v = significand * 2^exponent (with significand a 53bit integer).
  // If the exponent is larger than 20 (i.e. we may have a 73bit number) then we
  // don't know how to compute the representation. 2^73 ~= 9.5*10^21.
  // If necessary this limit could probably be increased, but we don't need
  // more.
  if (exponent > 20) return false;
  if (fractional_count > 20) return false;
  *length = 0;
  // At most kDoubleSignificandSize bits of the significand are non-zero.
  // Given a 64 bit integer we have 11 0s followed by 53 potentially non-zero
  // bits:  0..11*..0xxx..53*..xx
  if (exponent + kDoubleSignificandSize > 64) {
    // The exponent must be > 11.
    //
    // We know that v = significand * 2^exponent.
    // And the exponent > 11.
    // We simplify the task by dividing v by 10^17.
    // The quotient delivers the first digits, and the remainder fits into a 64
    // bit number.
    // Dividing by 10^17 is equivalent to dividing by 5^17*2^17.
    const uint64_t kFive17 = UINT64_2PART_C(0xB1, A2BC2EC5);  // 5^17
    uint64_t divisor = kFive17;
    int divisor_power = 17;
    uint64_t dividend = significand;
    uint32_t quotient;
    uint64_t remainder;
    // Let v = f * 2^e with f == significand and e == exponent.
    // Then need q (quotient) and r (remainder) as follows:
    //   v            = q * 10^17       + r
    //   f * 2^e      = q * 10^17       + r
    //   f * 2^e      = q * 5^17 * 2^17 + r
    // If e > 17 then
    //   f * 2^(e-17) = q * 5^17        + r/2^17
    // else
    //   f  = q * 5^17 * 2^(17-e) + r/2^e
    if (exponent > divisor_power) {
      // We only allow exponents of up to 20 and therefore (17 - e) <= 3
      dividend <<= exponent - divisor_power;
      quotient = static_cast<uint32_t>(dividend / divisor);
      remainder = (dividend % divisor) << divisor_power;
    } else {
      divisor <<= divisor_power - exponent;
      quotient = static_cast<uint32_t>(dividend / divisor);
      remainder = (dividend % divisor) << exponent;
    }
    FillDigits32(quotient, buffer, length);
    FillDigits64FixedLength(remainder, buffer, length);
    *decimal_point = *length;
  } else if (exponent >= 0) {
    // 0 <= exponent <= 11
    significand <<= exponent;
    FillDigits64(significand, buffer, length);
    *decimal_point = *length;
  } else if (exponent > -kDoubleSignificandSize) {
    // We have to cut the number.
    uint64_t integrals = significand >> -exponent;
    uint64_t fractionals = significand - (integrals << -exponent);
    if (integrals > kMaxUInt32) {
      FillDigits64(integrals, buffer, length);
    } else {
      FillDigits32(static_cast<uint32_t>(integrals), buffer, length);
    }
    *decimal_point = *length;
    FillFractionals(fractionals, exponent, fractional_count,
                    buffer, length, decimal_point);
  } else if (exponent < -128) {
    // This configuration (with at most 20 digits) means that all digits must be
    // 0.
    ASSERT(fractional_count <= 20);
    buffer[0] = '\0';
    *length = 0;
    *decimal_point = -fractional_count;
  } else {
    *decimal_point = 0;
    FillFractionals(significand, exponent, fractional_count,
                    buffer, length, decimal_point);
  }
  TrimZeros(buffer, length, decimal_point);
  buffer[*length] = '\0';
  if ((*length) == 0) {
    // The string is empty and the decimal_point thus has no importance. Mimick
    // Gay's dtoa and and set it to -fractional_count.
    *decimal_point = -fractional_count;
  }
  return true;
}